

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedSimulationDataGenerator.cpp
# Opt level: O2

U32 __thiscall
AsyncRgbLedSimulationDataGenerator::GenerateSimulationData
          (AsyncRgbLedSimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channel)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  
  uVar2 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  while( true ) {
    uVar3 = SimulationChannelDescriptor::GetCurrentSampleNumber();
    if (uVar2 <= uVar3) break;
    WriteReset(this);
    iVar4 = 6;
    while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
      CreateRGBWord(this);
    }
    uVar1 = this->mFrameCount + 1;
    this->mFrameCount = uVar1;
    if ((uVar1 % 7 == 0) && (this->mDoGenerateHighSpeedMode == true)) {
      this->mHighSpeedMode = (bool)(this->mHighSpeedMode ^ 1);
    }
  }
  *simulation_channel = &this->mLEDSimulationData;
  return 1;
}

Assistant:

U32 AsyncRgbLedSimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate,
                                                                SimulationChannelDescriptor** simulation_channel )
{
    U64 adjusted_largest_sample_requested =
        AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

    while( mLEDSimulationData.GetCurrentSampleNumber() < adjusted_largest_sample_requested )
    {
        WriteReset();

        // six RGB-triple cascade between resets, i.e six discrete LEDs
        // or two of the 3-LED combined drivers. We could perhaps make
        // this adjustable
        for( int t = 0; t < 6; ++t )
        {
            CreateRGBWord();
        }

        ++mFrameCount;

        // toggle high-speed mode every seven frames if it's supported
        if( ( ( mFrameCount % 7 ) == 0 ) && mDoGenerateHighSpeedMode )
        {
            mHighSpeedMode = !mHighSpeedMode;
        }
    }

    *simulation_channel = &mLEDSimulationData;
    return 1;
}